

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

int64_t __thiscall llvm::APInt::getSExtValue(APInt *this)

{
  uint uVar1;
  uint64_t uVar2;
  
  uVar1 = this->BitWidth;
  if (uVar1 < 0x41) {
    if (uVar1 == 0) {
      __assert_fail("B > 0 && \"Bit width can\'t be 0.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                    ,0x2f6,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
    }
    uVar2 = (long)((this->U).VAL << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
  }
  else {
    uVar1 = getMinSignedBits(this);
    if (0x40 < uVar1) {
      __assert_fail("getMinSignedBits() <= 64 && \"Too many bits for int64_t\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                    ,0x623,"int64_t llvm::APInt::getSExtValue() const");
    }
    uVar2 = *(this->U).pVal;
  }
  return uVar2;
}

Assistant:

int64_t getSExtValue() const {
    if (isSingleWord())
      return SignExtend64(U.VAL, BitWidth);
    assert(getMinSignedBits() <= 64 && "Too many bits for int64_t");
    return int64_t(U.pVal[0]);
  }